

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QSystemError createDirectoryWithParents(QByteArray *path,mode_t mode)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  void *pvVar5;
  long size;
  QSystemError QVar6;
  ulong uVar7;
  char *pcVar8;
  char *b;
  long in_FS_OFFSET;
  QByteArray local_d8;
  stat64 local_b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar8 = (path->d).ptr;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "";
  }
  iVar2 = mkdir(pcVar8,mode);
  if (iVar2 == 0) {
LAB_0012a0ae:
    QVar6.errorCode = 0;
    QVar6.errorScope = NoError;
    goto LAB_0012a22f;
  }
  puVar4 = (uint *)__errno_location();
  uVar3 = *puVar4;
  if (uVar3 == 0x1e) {
LAB_0012a060:
    memset(&local_b8,0xaa,0x90);
    pcVar8 = (path->d).ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    iVar2 = stat64(pcVar8,&local_b8);
    if (iVar2 == 0) {
      uVar3 = 0x11;
      if ((local_b8.st_mode & 0xf000) == 0x4000) goto LAB_0012a0ae;
    }
    else {
      uVar3 = *puVar4;
    }
  }
  else {
    if (uVar3 == 0x15) goto LAB_0012a0ae;
    if (uVar3 == 0x11) goto LAB_0012a060;
  }
  if (uVar3 != 2) {
    QVar6 = (QSystemError)((ulong)uVar3 | 0x100000000);
    goto LAB_0012a22f;
  }
  pcVar8 = (path->d).ptr;
  if ((pcVar8 == (char *)0x0) ||
     (lVar1 = (path->d).size, pvVar5 = qmemrchr(pcVar8,0x2f,lVar1 + (ulong)(lVar1 == 0)),
     pvVar5 == (void *)0x0)) {
    lVar1 = -1;
  }
  else {
    lVar1 = (long)pvVar5 - (long)pcVar8;
  }
  do {
    size = lVar1;
    if (size < 1) {
      QVar6.errorCode = 2;
      QVar6.errorScope = StandardLibraryError;
      goto LAB_0012a22f;
    }
    lVar1 = size + -1;
  } while (pcVar8[size + -1] == '/');
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_d8,pcVar8,size);
  QVar6 = createDirectoryWithParents(&local_d8,mode);
  if ((ulong)QVar6 >> 0x20 == 0) {
    pcVar8 = (path->d).ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = "";
    }
    iVar2 = mkdir(pcVar8,mode);
    if (iVar2 == 0) {
LAB_0012a1da:
      uVar7 = 0;
      uVar3 = 0;
    }
    else {
      puVar4 = (uint *)__errno_location();
      uVar3 = *puVar4;
      if (uVar3 == 0x1e) {
LAB_0012a188:
        memset(&local_b8,0xaa,0x90);
        pcVar8 = (path->d).ptr;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = "";
        }
        iVar2 = stat64(pcVar8,&local_b8);
        uVar7 = 0x100000000;
        if (iVar2 == 0) {
          uVar3 = 0x11;
          if ((local_b8.st_mode & 0xf000) == 0x4000) {
            uVar7 = 0;
            uVar3 = 0;
          }
        }
        else {
          uVar3 = *puVar4;
        }
      }
      else {
        if (uVar3 == 0x15) goto LAB_0012a1da;
        if (uVar3 == 0x11) goto LAB_0012a188;
        uVar7 = 0x100000000;
      }
    }
    QVar6 = (QSystemError)(uVar3 | uVar7);
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
    }
  }
LAB_0012a22f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return QVar6;
}

Assistant:

static QSystemError createDirectoryWithParents(const QByteArray &path, mode_t mode)
{
#ifdef Q_OS_WASM
    if (path == "/")
        return {};
#endif

    auto tryMkDir = [&path, mode]() -> QSystemError {
        if (QT_MKDIR(path, mode) == 0) {
#ifdef Q_OS_VXWORKS
            forceRequestedPermissionsOnVxWorks(path, mode);
#endif
            return {};
        }
        // On macOS with APFS mkdir sets errno to EISDIR, QTBUG-97110
        if (errno == EISDIR)
            return {};
        if (errno == EEXIST || errno == EROFS) {
            // ::mkdir() can fail if the dir already exists (it may have been
            // created by another thread or another process)
            QT_STATBUF st;
            if (QT_STAT(path.constData(), &st) != 0)
                return QSystemError::stdError(errno);
            const bool isDir = (st.st_mode & S_IFMT) == S_IFDIR;
            return isDir ? QSystemError{} : QSystemError::stdError(EEXIST);
        }
        return QSystemError::stdError(errno);
    };

    QSystemError result = tryMkDir();
    if (result.ok())
        return result;

    // Only handle non-existing dir components in the path
    if (result.errorCode != ENOENT)
        return result;

    qsizetype slash = path.lastIndexOf('/');
    while (slash > 0 && path[slash - 1] == '/')
        --slash;

    if (slash < 1)
        return result;

    // mkdir failed because the parent dir doesn't exist, so try to create it
    QByteArray parentPath = path.first(slash);
    if (result = createDirectoryWithParents(parentPath, mode); !result.ok())
        return result;

    // try again
    return tryMkDir();
}